

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void GUIDestroy(HGUI handle)

{
  GUI *gui;
  HGUI handle_local;
  
  if (*(void **)((long)handle + 0x10) != (void *)0x0) {
    operator_delete(*(void **)((long)handle + 0x10),0x41f80);
  }
  ShaderProgramDestroy((ShaderProgram *)handle);
  if (handle != (HGUI)0x0) {
    GUI::~GUI((GUI *)handle);
    operator_delete(handle,0x1a0cc8);
  }
  return;
}

Assistant:

void GUIDestroy(HGUI handle) {
    GUI* gui = (GUI*)handle;
    delete gui->Ctx;
    ShaderProgramDestroy(gui->Program);
    delete gui;
}